

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptFunction.h
# Opt level: O3

void __thiscall
Js::FunctionWithComputedName<Js::AsmJsScriptFunction>::FunctionWithComputedName
          (FunctionWithComputedName<Js::AsmJsScriptFunction> *this,FunctionProxy *proxy,
          ScriptFunctionType *deferredPrototypeType)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  AsmJsScriptFunction::AsmJsScriptFunction
            (&this->super_AsmJsScriptFunction,proxy,deferredPrototypeType);
  (this->super_AsmJsScriptFunction).super_ScriptFunction.super_ScriptFunctionBase.
  super_JavascriptFunction.super_DynamicObject.super_RecyclableObject.super_FinalizableObject =
       (FinalizableObject)&PTR_Finalize_01527848;
  (this->computedNameVar).ptr = (void *)0x0;
  if ((((proxy->functionInfo).ptr)->attributes & ComputedName) == None) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/ScriptFunction.h"
                                ,0x28,"(proxy->GetFunctionInfo()->HasComputedName())",
                                "proxy->GetFunctionInfo()->HasComputedName()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  return;
}

Assistant:

FunctionWithComputedName(FunctionProxy * proxy, ScriptFunctionType* deferredPrototypeType)
            : BaseClass(proxy, deferredPrototypeType), computedNameVar(nullptr)
        {
            Assert(proxy->GetFunctionInfo()->HasComputedName());
        }